

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

void __thiscall Shader::fix_version(Shader *this,string *code)

{
  string *psVar1;
  allocator<char> local_31;
  string ver_str;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&ver_str,"#version 330",&local_31);
  std::__cxx11::string::append((char *)&ver_str);
  if (*(code->_M_dataplus)._M_p == '#') {
    psVar1 = (string *)std::__cxx11::string::find((char)code,10);
    if (psVar1 == (string *)0xffffffffffffffff) {
      psVar1 = (string *)ver_str._M_string_length;
    }
    std::__cxx11::string::replace((ulong)code,0,psVar1);
  }
  else {
    std::__cxx11::string::push_back((char)&ver_str);
    std::__cxx11::string::replace((ulong)code,0,(string *)0x0);
  }
  std::__cxx11::string::~string((string *)&ver_str);
  return;
}

Assistant:

void Shader::fix_version(std::string& code)
{
    std::string ver_str = GLSL_VERSION_STR;
    ver_str += GLSL_PROFILE;

    // Version string is present -> need to set to current version
    if (code[0] == '#')
    {
        // Replace until end of the line
        size_t endl = code.find('\n');
        if (endl != std::string::npos)
            code.replace(0, endl, ver_str);
        else
            code.replace(0, ver_str.length(), ver_str);
    }
    else
    {
        // Prepend the version string
        ver_str += '\n';
        code.replace(0, 0, ver_str);
    }
}